

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

void Set_Value_Into_String(Am_Value *value)

{
  ostream *poVar1;
  ostream *this;
  ulong uVar2;
  ostrstream local_1e0 [8];
  ostrstream oss;
  char local_78 [8];
  char line [100];
  Am_Value *value_local;
  
  unique0x10000155 = value;
  poVar1 = std::operator<<((ostream *)&std::cout,"Value is `");
  poVar1 = (ostream *)operator<<(poVar1,(Am_Value *)stack0xfffffffffffffff0);
  poVar1 = std::operator<<(poVar1,"\'");
  this = (ostream *)
         std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  uVar2 = Am_Value::Valid();
  if ((uVar2 & 1) != 0) {
    std::ostrstream::ostrstream(local_1e0,local_78,100,_S_out);
    poVar1 = std::operator<<((ostream *)local_1e0,"Value is `");
    poVar1 = (ostream *)operator<<(poVar1,(Am_Value *)stack0xfffffffffffffff0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<((ostream *)poVar1,std::ends<char,std::char_traits<char>>);
    Am_Object::Set(0xa288,(char *)0xab,(ulong)local_78);
    std::ostrstream::~ostrstream(local_1e0);
  }
  return;
}

Assistant:

void Set_Value_Into_String(Am_Value &value) {
  cout << "Value is `" << value << "'" << endl << flush;
  if (value.Valid()) { //otherwise, user hit Cancel
    char line[100];
    OSTRSTREAM_CONSTR (oss,line, 100, ios::out);
    oss << "Value is `" << value << "'" << ends;
    OSTRSTREAM_COPY(oss,line,100);
    pop_up_value_string.Set(Am_TEXT, line);
  }
}